

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.c
# Opt level: O1

void BZ2_compressBlock(EState *s,Bool is_last_block)

{
  UChar (*paUVar1) [258];
  Int32 (*paIVar2) [258];
  short *psVar3;
  UChar UVar4;
  UChar UVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  bool bVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined4 *puVar81;
  undefined8 uVar82;
  UChar (*paUVar83) [258];
  byte bVar84;
  int iVar85;
  uint uVar86;
  int iVar87;
  long lVar88;
  UInt32 *pUVar89;
  char cVar90;
  byte bVar91;
  UChar UVar92;
  Int32 remF;
  uint uVar93;
  uint uVar94;
  ulong uVar95;
  ulong uVar96;
  uint uVar97;
  long lVar98;
  UInt16 *pUVar99;
  ulong uVar100;
  Bool *pBVar101;
  undefined7 in_register_00000031;
  UChar *pUVar102;
  ulong uVar103;
  int iVar104;
  size_t sVar105;
  UChar (*paUVar106) [258];
  size_t sVar107;
  Int32 (*paIVar108) [258];
  int iVar119;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  int iVar121;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  long lVar120;
  undefined1 auVar118 [16];
  long lVar125;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  int iVar167;
  int iVar171;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  UInt16 cost [6];
  Int32 fave [6];
  UChar local_1d8 [16];
  UInt16 *local_1c8;
  ulong local_1c0;
  uint local_1b8;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  undefined1 local_1a8 [16];
  size_t local_190;
  long local_188;
  ulong local_180;
  undefined4 local_174;
  Bool *local_170;
  UInt32 *local_168;
  size_t local_160;
  ulong local_158;
  UChar (*local_150) [258];
  size_t local_148;
  ulong local_140;
  undefined4 local_138;
  char acStack_134 [260];
  
  if (0 < s->nblock) {
    uVar86 = s->blockCRC;
    s->blockCRC = ~uVar86;
    s->combinedCRC = (s->combinedCRC << 1 | (uint)((int)s->combinedCRC < 0)) ^ ~uVar86;
    if (1 < s->blockNo) {
      s->numZ = 0;
    }
    BZ2_blockSort(s);
  }
  s->zbits = (UChar *)((long)s->nblock + (long)s->arr2);
  if (s->blockNo == 1) {
    s->bsBuff = 0;
    s->bsLive = 0;
    bsPutUChar(s,'B');
    bsPutUChar(s,'Z');
    bsPutUChar(s,'h');
    bsPutUChar(s,(char)s->blockSize100k + '0');
  }
  if (s->nblock < 1) goto LAB_00574082;
  bsPutUChar(s,'1');
  bsPutUChar(s,'A');
  bsPutUChar(s,'Y');
  bsPutUChar(s,'&');
  bsPutUChar(s,'S');
  bsPutUChar(s,'Y');
  bsPutUInt32(s,s->blockCRC);
  iVar85 = s->bsLive;
  if (7 < iVar85) {
    do {
      s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
      s->numZ = s->numZ + 1;
      s->bsBuff = s->bsBuff << 8;
      iVar119 = s->bsLive;
      iVar85 = iVar119 + -8;
      s->bsLive = iVar85;
    } while (0xf < iVar119);
  }
  local_174 = (int)CONCAT71(in_register_00000031,is_last_block);
  iVar85 = iVar85 + 1;
  s->bsLive = iVar85;
  iVar119 = s->origPtr;
  if (7 < iVar85) {
    do {
      s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
      s->numZ = s->numZ + 1;
      s->bsBuff = s->bsBuff << 8;
      iVar121 = s->bsLive;
      iVar85 = iVar121 + -8;
      s->bsLive = iVar85;
    } while (0xf < iVar121);
  }
  s->bsBuff = s->bsBuff | iVar119 << (8U - (char)iVar85 & 0x1f);
  s->bsLive = iVar85 + 0x18;
  pUVar89 = s->ptr;
  pUVar102 = s->block;
  local_1c8 = s->mtfv;
  s->nInUse = 0;
  local_170 = s->inUse;
  lVar88 = -0x100;
  do {
    if (s->unseqToSeq[lVar88] != '\0') {
      iVar85 = s->nInUse;
      *(char *)((long)s->mtfFreq + lVar88 + -0x20) = (char)iVar85;
      s->nInUse = iVar85 + 1;
    }
    lVar88 = lVar88 + 1;
  } while (lVar88 != 0);
  iVar85 = s->nInUse;
  lVar88 = (long)iVar85;
  if (-2 < lVar88) {
    memset(s->mtfFreq,0,(ulong)(iVar85 + 2) << 2);
  }
  if (0 < iVar85) {
    lVar98 = lVar88 + -1;
    local_1a8._8_4_ = (int)lVar98;
    local_1a8._0_8_ = lVar98;
    local_1a8._12_4_ = (int)((ulong)lVar98 >> 0x20);
    uVar95 = 0;
    auVar109 = local_1a8;
    auVar128 = _DAT_00632da0;
    auVar126 = _DAT_00632db0;
    auVar131 = _DAT_00632dc0;
    in_XMM4 = _DAT_00632dd0;
    auVar139 = _DAT_00632de0;
    auVar140 = _DAT_00632df0;
    auVar141 = _DAT_00632e00;
    auVar142 = _DAT_00632e10;
    do {
      auVar152 = local_1a8 ^ _DAT_005d8eb0;
      auVar154 = auVar142 ^ _DAT_005d8eb0;
      iVar119 = auVar152._0_4_;
      iVar167 = -(uint)(iVar119 < auVar154._0_4_);
      iVar121 = auVar152._4_4_;
      auVar156._4_4_ = -(uint)(iVar121 < auVar154._4_4_);
      iVar87 = auVar152._8_4_;
      iVar171 = -(uint)(iVar87 < auVar154._8_4_);
      iVar104 = auVar152._12_4_;
      auVar156._12_4_ = -(uint)(iVar104 < auVar154._12_4_);
      auVar152._4_4_ = iVar167;
      auVar152._0_4_ = iVar167;
      auVar152._8_4_ = iVar171;
      auVar152._12_4_ = iVar171;
      auVar152 = pshuflw(auVar109,auVar152,0xe8);
      auVar155._4_4_ = -(uint)(auVar154._4_4_ == iVar121);
      auVar155._12_4_ = -(uint)(auVar154._12_4_ == iVar104);
      auVar155._0_4_ = auVar155._4_4_;
      auVar155._8_4_ = auVar155._12_4_;
      auVar143 = pshuflw(in_XMM11,auVar155,0xe8);
      auVar156._0_4_ = auVar156._4_4_;
      auVar156._8_4_ = auVar156._12_4_;
      auVar154 = pshuflw(auVar152,auVar156,0xe8);
      auVar109._8_4_ = 0xffffffff;
      auVar109._0_8_ = 0xffffffffffffffff;
      auVar109._12_4_ = 0xffffffff;
      auVar109 = (auVar154 | auVar143 & auVar152) ^ auVar109;
      auVar109 = packssdw(auVar109,auVar109);
      cVar90 = (char)uVar95;
      if ((auVar109 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(char *)((long)&local_138 + uVar95) = cVar90;
      }
      auVar143._4_4_ = iVar167;
      auVar143._0_4_ = iVar167;
      auVar143._8_4_ = iVar171;
      auVar143._12_4_ = iVar171;
      auVar156 = auVar155 & auVar143 | auVar156;
      auVar109 = packssdw(auVar156,auVar156);
      auVar154._8_4_ = 0xffffffff;
      auVar154._0_8_ = 0xffffffffffffffff;
      auVar154._12_4_ = 0xffffffff;
      auVar109 = packssdw(auVar109 ^ auVar154,auVar109 ^ auVar154);
      auVar109 = packsswb(auVar109,auVar109);
      if ((auVar109._0_4_ >> 8 & 1) != 0) {
        *(char *)((long)&local_138 + uVar95 + 1) = cVar90 + '\x01';
      }
      auVar109 = auVar141 ^ _DAT_005d8eb0;
      auVar144._0_4_ = -(uint)(iVar119 < auVar109._0_4_);
      auVar144._4_4_ = -(uint)(iVar121 < auVar109._4_4_);
      auVar144._8_4_ = -(uint)(iVar87 < auVar109._8_4_);
      auVar144._12_4_ = -(uint)(iVar104 < auVar109._12_4_);
      auVar157._4_4_ = auVar144._0_4_;
      auVar157._0_4_ = auVar144._0_4_;
      auVar157._8_4_ = auVar144._8_4_;
      auVar157._12_4_ = auVar144._8_4_;
      iVar167 = -(uint)(auVar109._4_4_ == iVar121);
      iVar171 = -(uint)(auVar109._12_4_ == iVar104);
      auVar66._4_4_ = iVar167;
      auVar66._0_4_ = iVar167;
      auVar66._8_4_ = iVar171;
      auVar66._12_4_ = iVar171;
      auVar168._4_4_ = auVar144._4_4_;
      auVar168._0_4_ = auVar144._4_4_;
      auVar168._8_4_ = auVar144._12_4_;
      auVar168._12_4_ = auVar144._12_4_;
      auVar109 = auVar66 & auVar157 | auVar168;
      auVar109 = packssdw(auVar109,auVar109);
      auVar57._8_4_ = 0xffffffff;
      auVar57._0_8_ = 0xffffffffffffffff;
      auVar57._12_4_ = 0xffffffff;
      auVar109 = packssdw(auVar109 ^ auVar57,auVar109 ^ auVar57);
      auVar109 = packsswb(auVar109,auVar109);
      if ((auVar109._0_4_ >> 0x10 & 1) != 0) {
        *(char *)((long)&local_138 + uVar95 + 2) = cVar90 + '\x02';
      }
      auVar109 = pshufhw(auVar109,auVar157,0x84);
      auVar67._4_4_ = iVar167;
      auVar67._0_4_ = iVar167;
      auVar67._8_4_ = iVar171;
      auVar67._12_4_ = iVar171;
      auVar154 = pshufhw(auVar144,auVar67,0x84);
      auVar152 = pshufhw(auVar109,auVar168,0x84);
      auVar110._8_4_ = 0xffffffff;
      auVar110._0_8_ = 0xffffffffffffffff;
      auVar110._12_4_ = 0xffffffff;
      auVar110 = (auVar152 | auVar154 & auVar109) ^ auVar110;
      auVar109 = packssdw(auVar110,auVar110);
      auVar109 = packsswb(auVar109,auVar109);
      if ((auVar109._0_4_ >> 0x18 & 1) != 0) {
        *(char *)((long)&local_138 + uVar95 + 3) = cVar90 + '\x03';
      }
      auVar109 = auVar140 ^ _DAT_005d8eb0;
      auVar145._0_4_ = -(uint)(iVar119 < auVar109._0_4_);
      auVar145._4_4_ = -(uint)(iVar121 < auVar109._4_4_);
      auVar145._8_4_ = -(uint)(iVar87 < auVar109._8_4_);
      auVar145._12_4_ = -(uint)(iVar104 < auVar109._12_4_);
      auVar68._4_4_ = auVar145._0_4_;
      auVar68._0_4_ = auVar145._0_4_;
      auVar68._8_4_ = auVar145._8_4_;
      auVar68._12_4_ = auVar145._8_4_;
      auVar154 = pshuflw(auVar168,auVar68,0xe8);
      auVar111._0_4_ = -(uint)(auVar109._0_4_ == iVar119);
      auVar111._4_4_ = -(uint)(auVar109._4_4_ == iVar121);
      auVar111._8_4_ = -(uint)(auVar109._8_4_ == iVar87);
      auVar111._12_4_ = -(uint)(auVar109._12_4_ == iVar104);
      auVar158._4_4_ = auVar111._4_4_;
      auVar158._0_4_ = auVar111._4_4_;
      auVar158._8_4_ = auVar111._12_4_;
      auVar158._12_4_ = auVar111._12_4_;
      auVar109 = pshuflw(auVar111,auVar158,0xe8);
      auVar159._4_4_ = auVar145._4_4_;
      auVar159._0_4_ = auVar145._4_4_;
      auVar159._8_4_ = auVar145._12_4_;
      auVar159._12_4_ = auVar145._12_4_;
      auVar152 = pshuflw(auVar145,auVar159,0xe8);
      auVar58._8_4_ = 0xffffffff;
      auVar58._0_8_ = 0xffffffffffffffff;
      auVar58._12_4_ = 0xffffffff;
      auVar109 = packssdw(auVar109 & auVar154,(auVar152 | auVar109 & auVar154) ^ auVar58);
      auVar109 = packsswb(auVar109,auVar109);
      if ((auVar109 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        acStack_134[uVar95] = cVar90 + '\x04';
      }
      auVar69._4_4_ = auVar145._0_4_;
      auVar69._0_4_ = auVar145._0_4_;
      auVar69._8_4_ = auVar145._8_4_;
      auVar69._12_4_ = auVar145._8_4_;
      auVar159 = auVar158 & auVar69 | auVar159;
      auVar152 = packssdw(auVar159,auVar159);
      auVar59._8_4_ = 0xffffffff;
      auVar59._0_8_ = 0xffffffffffffffff;
      auVar59._12_4_ = 0xffffffff;
      auVar109 = packssdw(auVar109,auVar152 ^ auVar59);
      auVar109 = packsswb(auVar109,auVar109);
      if ((auVar109._4_2_ >> 8 & 1) != 0) {
        acStack_134[uVar95 + 1] = cVar90 + '\x05';
      }
      auVar109 = auVar139 ^ _DAT_005d8eb0;
      auVar146._0_4_ = -(uint)(iVar119 < auVar109._0_4_);
      auVar146._4_4_ = -(uint)(iVar121 < auVar109._4_4_);
      auVar146._8_4_ = -(uint)(iVar87 < auVar109._8_4_);
      auVar146._12_4_ = -(uint)(iVar104 < auVar109._12_4_);
      auVar160._4_4_ = auVar146._0_4_;
      auVar160._0_4_ = auVar146._0_4_;
      auVar160._8_4_ = auVar146._8_4_;
      auVar160._12_4_ = auVar146._8_4_;
      iVar167 = -(uint)(auVar109._4_4_ == iVar121);
      iVar171 = -(uint)(auVar109._12_4_ == iVar104);
      auVar70._4_4_ = iVar167;
      auVar70._0_4_ = iVar167;
      auVar70._8_4_ = iVar171;
      auVar70._12_4_ = iVar171;
      auVar169._4_4_ = auVar146._4_4_;
      auVar169._0_4_ = auVar146._4_4_;
      auVar169._8_4_ = auVar146._12_4_;
      auVar169._12_4_ = auVar146._12_4_;
      auVar109 = auVar70 & auVar160 | auVar169;
      auVar109 = packssdw(auVar109,auVar109);
      auVar60._8_4_ = 0xffffffff;
      auVar60._0_8_ = 0xffffffffffffffff;
      auVar60._12_4_ = 0xffffffff;
      auVar109 = packssdw(auVar109 ^ auVar60,auVar109 ^ auVar60);
      auVar109 = packsswb(auVar109,auVar109);
      if ((auVar109 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        acStack_134[uVar95 + 2] = cVar90 + '\x06';
      }
      auVar109 = pshufhw(auVar109,auVar160,0x84);
      auVar71._4_4_ = iVar167;
      auVar71._0_4_ = iVar167;
      auVar71._8_4_ = iVar171;
      auVar71._12_4_ = iVar171;
      auVar154 = pshufhw(auVar146,auVar71,0x84);
      auVar152 = pshufhw(auVar109,auVar169,0x84);
      auVar112._8_4_ = 0xffffffff;
      auVar112._0_8_ = 0xffffffffffffffff;
      auVar112._12_4_ = 0xffffffff;
      auVar112 = (auVar152 | auVar154 & auVar109) ^ auVar112;
      auVar109 = packssdw(auVar112,auVar112);
      auVar109 = packsswb(auVar109,auVar109);
      if ((auVar109._6_2_ >> 8 & 1) != 0) {
        acStack_134[uVar95 + 3] = cVar90 + '\a';
      }
      auVar109 = in_XMM4 ^ _DAT_005d8eb0;
      auVar147._0_4_ = -(uint)(iVar119 < auVar109._0_4_);
      auVar147._4_4_ = -(uint)(iVar121 < auVar109._4_4_);
      auVar147._8_4_ = -(uint)(iVar87 < auVar109._8_4_);
      auVar147._12_4_ = -(uint)(iVar104 < auVar109._12_4_);
      auVar72._4_4_ = auVar147._0_4_;
      auVar72._0_4_ = auVar147._0_4_;
      auVar72._8_4_ = auVar147._8_4_;
      auVar72._12_4_ = auVar147._8_4_;
      auVar154 = pshuflw(auVar169,auVar72,0xe8);
      auVar113._0_4_ = -(uint)(auVar109._0_4_ == iVar119);
      auVar113._4_4_ = -(uint)(auVar109._4_4_ == iVar121);
      auVar113._8_4_ = -(uint)(auVar109._8_4_ == iVar87);
      auVar113._12_4_ = -(uint)(auVar109._12_4_ == iVar104);
      auVar161._4_4_ = auVar113._4_4_;
      auVar161._0_4_ = auVar113._4_4_;
      auVar161._8_4_ = auVar113._12_4_;
      auVar161._12_4_ = auVar113._12_4_;
      auVar109 = pshuflw(auVar113,auVar161,0xe8);
      auVar162._4_4_ = auVar147._4_4_;
      auVar162._0_4_ = auVar147._4_4_;
      auVar162._8_4_ = auVar147._12_4_;
      auVar162._12_4_ = auVar147._12_4_;
      auVar152 = pshuflw(auVar147,auVar162,0xe8);
      auVar148._8_4_ = 0xffffffff;
      auVar148._0_8_ = 0xffffffffffffffff;
      auVar148._12_4_ = 0xffffffff;
      auVar148 = (auVar152 | auVar109 & auVar154) ^ auVar148;
      auVar152 = packssdw(auVar148,auVar148);
      auVar109 = packsswb(auVar109 & auVar154,auVar152);
      if ((auVar109 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        acStack_134[uVar95 + 4] = cVar90 + '\b';
      }
      auVar73._4_4_ = auVar147._0_4_;
      auVar73._0_4_ = auVar147._0_4_;
      auVar73._8_4_ = auVar147._8_4_;
      auVar73._12_4_ = auVar147._8_4_;
      auVar162 = auVar161 & auVar73 | auVar162;
      auVar152 = packssdw(auVar162,auVar162);
      auVar61._8_4_ = 0xffffffff;
      auVar61._0_8_ = 0xffffffffffffffff;
      auVar61._12_4_ = 0xffffffff;
      auVar152 = packssdw(auVar152 ^ auVar61,auVar152 ^ auVar61);
      auVar109 = packsswb(auVar109,auVar152);
      if ((auVar109._8_2_ >> 8 & 1) != 0) {
        acStack_134[uVar95 + 5] = cVar90 + '\t';
      }
      auVar109 = auVar131 ^ _DAT_005d8eb0;
      auVar149._0_4_ = -(uint)(iVar119 < auVar109._0_4_);
      auVar149._4_4_ = -(uint)(iVar121 < auVar109._4_4_);
      auVar149._8_4_ = -(uint)(iVar87 < auVar109._8_4_);
      auVar149._12_4_ = -(uint)(iVar104 < auVar109._12_4_);
      auVar163._4_4_ = auVar149._0_4_;
      auVar163._0_4_ = auVar149._0_4_;
      auVar163._8_4_ = auVar149._8_4_;
      auVar163._12_4_ = auVar149._8_4_;
      iVar167 = -(uint)(auVar109._4_4_ == iVar121);
      iVar171 = -(uint)(auVar109._12_4_ == iVar104);
      auVar74._4_4_ = iVar167;
      auVar74._0_4_ = iVar167;
      auVar74._8_4_ = iVar171;
      auVar74._12_4_ = iVar171;
      auVar170._4_4_ = auVar149._4_4_;
      auVar170._0_4_ = auVar149._4_4_;
      auVar170._8_4_ = auVar149._12_4_;
      auVar170._12_4_ = auVar149._12_4_;
      auVar109 = auVar74 & auVar163 | auVar170;
      auVar109 = packssdw(auVar109,auVar109);
      auVar62._8_4_ = 0xffffffff;
      auVar62._0_8_ = 0xffffffffffffffff;
      auVar62._12_4_ = 0xffffffff;
      auVar109 = packssdw(auVar109 ^ auVar62,auVar109 ^ auVar62);
      auVar109 = packsswb(auVar109,auVar109);
      if ((auVar109 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        acStack_134[uVar95 + 6] = cVar90 + '\n';
      }
      auVar109 = pshufhw(auVar109,auVar163,0x84);
      auVar75._4_4_ = iVar167;
      auVar75._0_4_ = iVar167;
      auVar75._8_4_ = iVar171;
      auVar75._12_4_ = iVar171;
      auVar154 = pshufhw(auVar149,auVar75,0x84);
      auVar152 = pshufhw(auVar109,auVar170,0x84);
      auVar114._8_4_ = 0xffffffff;
      auVar114._0_8_ = 0xffffffffffffffff;
      auVar114._12_4_ = 0xffffffff;
      auVar114 = (auVar152 | auVar154 & auVar109) ^ auVar114;
      auVar109 = packssdw(auVar114,auVar114);
      auVar109 = packsswb(auVar109,auVar109);
      if ((auVar109._10_2_ >> 8 & 1) != 0) {
        acStack_134[uVar95 + 7] = cVar90 + '\v';
      }
      auVar109 = auVar126 ^ _DAT_005d8eb0;
      auVar150._0_4_ = -(uint)(iVar119 < auVar109._0_4_);
      auVar150._4_4_ = -(uint)(iVar121 < auVar109._4_4_);
      auVar150._8_4_ = -(uint)(iVar87 < auVar109._8_4_);
      auVar150._12_4_ = -(uint)(iVar104 < auVar109._12_4_);
      auVar76._4_4_ = auVar150._0_4_;
      auVar76._0_4_ = auVar150._0_4_;
      auVar76._8_4_ = auVar150._8_4_;
      auVar76._12_4_ = auVar150._8_4_;
      auVar154 = pshuflw(auVar170,auVar76,0xe8);
      auVar115._0_4_ = -(uint)(auVar109._0_4_ == iVar119);
      auVar115._4_4_ = -(uint)(auVar109._4_4_ == iVar121);
      auVar115._8_4_ = -(uint)(auVar109._8_4_ == iVar87);
      auVar115._12_4_ = -(uint)(auVar109._12_4_ == iVar104);
      auVar164._4_4_ = auVar115._4_4_;
      auVar164._0_4_ = auVar115._4_4_;
      auVar164._8_4_ = auVar115._12_4_;
      auVar164._12_4_ = auVar115._12_4_;
      auVar109 = pshuflw(auVar115,auVar164,0xe8);
      auVar165._4_4_ = auVar150._4_4_;
      auVar165._0_4_ = auVar150._4_4_;
      auVar165._8_4_ = auVar150._12_4_;
      auVar165._12_4_ = auVar150._12_4_;
      auVar152 = pshuflw(auVar150,auVar165,0xe8);
      auVar63._8_4_ = 0xffffffff;
      auVar63._0_8_ = 0xffffffffffffffff;
      auVar63._12_4_ = 0xffffffff;
      auVar109 = packssdw(auVar109 & auVar154,(auVar152 | auVar109 & auVar154) ^ auVar63);
      auVar109 = packsswb(auVar109,auVar109);
      if ((auVar109 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        acStack_134[uVar95 + 8] = cVar90 + '\f';
      }
      auVar77._4_4_ = auVar150._0_4_;
      auVar77._0_4_ = auVar150._0_4_;
      auVar77._8_4_ = auVar150._8_4_;
      auVar77._12_4_ = auVar150._8_4_;
      auVar165 = auVar164 & auVar77 | auVar165;
      auVar152 = packssdw(auVar165,auVar165);
      auVar64._8_4_ = 0xffffffff;
      auVar64._0_8_ = 0xffffffffffffffff;
      auVar64._12_4_ = 0xffffffff;
      auVar109 = packssdw(auVar109,auVar152 ^ auVar64);
      auVar109 = packsswb(auVar109,auVar109);
      if ((auVar109._12_2_ >> 8 & 1) != 0) {
        acStack_134[uVar95 + 9] = cVar90 + '\r';
      }
      auVar109 = auVar128 ^ _DAT_005d8eb0;
      auVar151._0_4_ = -(uint)(iVar119 < auVar109._0_4_);
      auVar151._4_4_ = -(uint)(iVar121 < auVar109._4_4_);
      auVar151._8_4_ = -(uint)(iVar87 < auVar109._8_4_);
      auVar151._12_4_ = -(uint)(iVar104 < auVar109._12_4_);
      auVar166._4_4_ = auVar151._0_4_;
      auVar166._0_4_ = auVar151._0_4_;
      auVar166._8_4_ = auVar151._8_4_;
      auVar166._12_4_ = auVar151._8_4_;
      iVar119 = -(uint)(auVar109._4_4_ == iVar121);
      iVar121 = -(uint)(auVar109._12_4_ == iVar104);
      auVar153._4_4_ = iVar119;
      auVar153._0_4_ = iVar119;
      auVar153._8_4_ = iVar121;
      auVar153._12_4_ = iVar121;
      auVar116._4_4_ = auVar151._4_4_;
      auVar116._0_4_ = auVar151._4_4_;
      auVar116._8_4_ = auVar151._12_4_;
      auVar116._12_4_ = auVar151._12_4_;
      auVar116 = auVar153 & auVar166 | auVar116;
      auVar109 = packssdw(auVar116,auVar116);
      auVar65._8_4_ = 0xffffffff;
      auVar65._0_8_ = 0xffffffffffffffff;
      auVar65._12_4_ = 0xffffffff;
      auVar109 = packssdw(auVar109 ^ auVar65,auVar109 ^ auVar65);
      auVar109 = packsswb(auVar109,auVar109);
      if ((auVar109 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        acStack_134[uVar95 + 10] = cVar90 + '\x0e';
      }
      auVar109 = pshufhw(auVar109,auVar166,0x84);
      in_XMM11 = pshufhw(auVar151,auVar153,0x84);
      in_XMM11 = in_XMM11 & auVar109;
      auVar78._4_4_ = auVar151._4_4_;
      auVar78._0_4_ = auVar151._4_4_;
      auVar78._8_4_ = auVar151._12_4_;
      auVar78._12_4_ = auVar151._12_4_;
      auVar109 = pshufhw(auVar109,auVar78,0x84);
      auVar117._8_4_ = 0xffffffff;
      auVar117._0_8_ = 0xffffffffffffffff;
      auVar117._12_4_ = 0xffffffff;
      auVar117 = (auVar109 | in_XMM11) ^ auVar117;
      auVar109 = packssdw(auVar117,auVar117);
      auVar109 = packsswb(auVar109,auVar109);
      if ((auVar109._14_2_ >> 8 & 1) != 0) {
        acStack_134[uVar95 + 0xb] = cVar90 + '\x0f';
      }
      uVar95 = uVar95 + 0x10;
      lVar98 = (long)DAT_00632e20;
      lVar125 = auVar142._8_8_;
      auVar142._0_8_ = auVar142._0_8_ + lVar98;
      lVar120 = DAT_00632e20._8_8_;
      auVar142._8_8_ = lVar125 + lVar120;
      lVar125 = auVar141._8_8_;
      auVar141._0_8_ = auVar141._0_8_ + lVar98;
      auVar141._8_8_ = lVar125 + lVar120;
      lVar125 = auVar140._8_8_;
      auVar140._0_8_ = auVar140._0_8_ + lVar98;
      auVar140._8_8_ = lVar125 + lVar120;
      lVar125 = auVar139._8_8_;
      auVar139._0_8_ = auVar139._0_8_ + lVar98;
      auVar139._8_8_ = lVar125 + lVar120;
      lVar125 = in_XMM4._8_8_;
      in_XMM4._0_8_ = in_XMM4._0_8_ + lVar98;
      in_XMM4._8_8_ = lVar125 + lVar120;
      lVar125 = auVar131._8_8_;
      auVar131._0_8_ = auVar131._0_8_ + lVar98;
      auVar131._8_8_ = lVar125 + lVar120;
      lVar125 = auVar126._8_8_;
      auVar126._0_8_ = auVar126._0_8_ + lVar98;
      auVar126._8_8_ = lVar125 + lVar120;
      lVar125 = auVar128._8_8_;
      auVar128._0_8_ = auVar128._0_8_ + lVar98;
      auVar128._8_8_ = lVar125 + lVar120;
      auVar109 = _DAT_00632e20;
    } while ((iVar85 + 0xfU & 0xfffffff0) != uVar95);
  }
  uVar95 = (ulong)(uint)s->nblock;
  if (s->nblock < 1) {
    uVar86 = 0;
    iVar119 = 0;
  }
  else {
    lVar98 = 0;
    iVar119 = 0;
    uVar86 = 0;
    do {
      UVar4 = local_138._1_1_;
      UVar92 = s->unseqToSeq
               [pUVar102[(int)(((int)(pUVar89[lVar98] - 1) >> 0x1f & (uint)uVar95) + pUVar89[lVar98]
                              + -1)]];
      if ((UChar)local_138 == UVar92) {
        iVar119 = iVar119 + 1;
      }
      else {
        if (0 < iVar119) {
          uVar93 = iVar119 - 1;
          uVar95 = (ulong)(int)uVar86;
          pUVar99 = local_1c8 + uVar95;
          while( true ) {
            uVar86 = (int)uVar95 + 1;
            uVar95 = (ulong)uVar86;
            if ((uVar93 & 1) == 0) {
              *pUVar99 = 0;
              s->mtfFreq[0] = s->mtfFreq[0] + 1;
            }
            else {
              *pUVar99 = 1;
              s->mtfFreq[1] = s->mtfFreq[1] + 1;
            }
            if ((int)uVar93 < 2) break;
            uVar93 = uVar93 - 2 >> 1;
            pUVar99 = pUVar99 + 1;
          }
          iVar119 = 0;
        }
        local_138._1_1_ = (UChar)local_138;
        puVar81 = &local_138;
        while (UVar92 != UVar4) {
          UVar5 = *(UChar *)((long)puVar81 + 2);
          *(UChar *)((long)puVar81 + 2) = UVar4;
          UVar4 = UVar5;
          puVar81 = (undefined4 *)((long)puVar81 + 1);
        }
        local_138._0_1_ = UVar4;
        iVar121 = ((int)(undefined4 *)((long)puVar81 + 1) - (int)&local_138) + 1;
        local_1c8[(int)uVar86] = (UInt16)iVar121;
        uVar86 = uVar86 + 1;
        s->mtfFreq[iVar121] = s->mtfFreq[iVar121] + 1;
      }
      lVar98 = lVar98 + 1;
      uVar95 = (ulong)s->nblock;
    } while (lVar98 < (long)uVar95);
  }
  if (0 < iVar119) {
    uVar93 = iVar119 - 1;
    uVar95 = (ulong)(int)uVar86;
    pUVar99 = local_1c8 + uVar95;
    while( true ) {
      uVar86 = (int)uVar95 + 1;
      uVar95 = (ulong)uVar86;
      if ((uVar93 & 1) == 0) {
        *pUVar99 = 0;
        s->mtfFreq[0] = s->mtfFreq[0] + 1;
      }
      else {
        *pUVar99 = 1;
        s->mtfFreq[1] = s->mtfFreq[1] + 1;
      }
      if ((int)uVar93 < 2) break;
      uVar93 = uVar93 - 2 >> 1;
      pUVar99 = pUVar99 + 1;
    }
  }
  local_1c8[(int)uVar86] = (short)iVar85 + 1;
  s->mtfFreq[lVar88 + 1] = s->mtfFreq[lVar88 + 1] + 1;
  s->nMTF = uVar86 + 1;
  iVar85 = s->nInUse;
  uVar86 = iVar85 + 2;
  sVar107 = 1;
  if (1 < (int)uVar86) {
    sVar107 = (size_t)uVar86;
  }
  paUVar1 = s->len;
  lVar88 = 0;
  do {
    if (-2 < iVar85) {
      memset(*paUVar1 + lVar88,0xf,sVar107);
    }
    lVar88 = lVar88 + 0x102;
  } while (lVar88 != 0x60c);
  if (s->nMTF < 1) {
    bz_internal_error(0xbb9);
  }
  iVar119 = s->nMTF;
  iVar121 = 0;
  if (iVar119 < 200) {
    uVar93 = 2;
LAB_00571b03:
    local_1c0 = 0;
  }
  else {
    if (iVar119 < 600) {
      uVar93 = 3;
      goto LAB_00571b03;
    }
    if (iVar119 < 0x4b0) {
      uVar93 = 4;
      goto LAB_00571b03;
    }
    local_1c0 = (ulong)(0x95f < iVar119);
    uVar93 = (0x95f < iVar119) + 5;
  }
  uVar96 = (ulong)uVar93;
  pUVar102 = s->selectorMtf + (ulong)(uVar93 * 0x102) + 0x4550;
  uVar95 = uVar96;
  do {
    iVar87 = iVar119 / (int)uVar95;
    uVar97 = iVar121 - 1;
    uVar100 = (ulong)uVar97;
    iVar104 = 0;
    if ((0 < iVar87) && ((int)uVar97 <= iVar85)) {
      iVar104 = 0;
      uVar103 = (long)(int)uVar97;
      do {
        iVar104 = iVar104 + s->mtfFreq[uVar103 + 1];
        uVar100 = uVar103 + 1;
        if ((long)iVar85 <= (long)uVar103) break;
        uVar103 = uVar100;
      } while (iVar104 < iVar87);
    }
    iVar87 = (int)uVar100;
    if (((iVar121 < iVar87) && (uVar95 != 1 && uVar95 != uVar96)) &&
       ((uVar93 - (int)uVar95 & 0x80000001) == 1)) {
      iVar104 = iVar104 - s->mtfFreq[iVar87];
      iVar87 = iVar87 + -1;
    }
    if (-2 < iVar85) {
      sVar105 = 0;
      do {
        UVar92 = '\0';
        if ((long)iVar87 < (long)sVar105) {
          UVar92 = '\x0f';
        }
        if ((long)sVar105 < (long)iVar121) {
          UVar92 = '\x0f';
        }
        pUVar102[sVar105] = UVar92;
        sVar105 = sVar105 + 1;
      } while (sVar107 != sVar105);
    }
    iVar121 = iVar87 + 1;
    iVar119 = iVar119 - iVar104;
    pUVar102 = pUVar102 + -0x102;
    bVar56 = 1 < (long)uVar95;
    uVar95 = uVar95 - 1;
  } while (bVar56);
  paIVar2 = s->rfreq;
  local_160 = (size_t)(uVar93 * 4);
  local_148 = sVar107 * 4;
  local_140 = (ulong)(uVar93 * 2);
  bVar84 = -2 < iVar85 & (byte)local_1c0;
  local_180 = (ulong)(uVar93 * 0x408);
  local_168 = s->len_pack[0] + 2;
  local_150 = s->len;
  uVar95 = 0;
  local_1b8 = uVar86;
  local_190 = sVar107;
  local_188 = (long)iVar85;
  do {
    sVar107 = local_190;
    local_158 = uVar95;
    memset(&local_138,0,local_160);
    lVar88 = local_188;
    uVar95 = 0;
    do {
      if (-2 < (int)lVar88) {
        memset((void *)((long)*paIVar2 + uVar95),0,local_148);
      }
      pUVar99 = local_1c8;
      uVar95 = uVar95 + 0x408;
    } while (local_180 != uVar95);
    if (bVar84 != 0) {
      sVar105 = 0;
      pUVar89 = local_168;
      do {
        (*(UInt32 (*) [4])(pUVar89 + -2))[0] =
             (uint)s->len[0][sVar105] | (uint)s->len[1][sVar105] << 0x10;
        pUVar89[-1] = (uint)s->len[2][sVar105] | (uint)s->len[3][sVar105] << 0x10;
        *pUVar89 = (uint)s->len[4][sVar105] | (uint)s->len[5][sVar105] << 0x10;
        sVar105 = sVar105 + 1;
        pUVar89 = pUVar89 + 4;
      } while (sVar107 != sVar105);
    }
    iVar85 = s->nMTF;
    paUVar106 = paUVar1;
    paIVar108 = paIVar2;
    uVar95 = uVar96;
    if (iVar85 < 1) {
      auVar80._8_8_ = 0;
      auVar80._0_8_ = local_1a8._8_8_;
      local_1a8 = auVar80 << 0x40;
    }
    else {
      auVar79._8_8_ = 0;
      auVar79._0_8_ = local_1a8._8_8_;
      local_1a8 = auVar79 << 0x40;
      iVar119 = 0;
      do {
        memset(&local_1b4,0,local_140);
        paUVar83 = local_150;
        iVar121 = iVar85 + -1;
        if (iVar119 + 0x31 < iVar85) {
          iVar121 = iVar119 + 0x31;
        }
        bVar91 = iVar121 - iVar119 == 0x31 & (byte)local_1c0;
        uVar82 = local_1a8._0_8_;
        if (bVar91 == 0) {
          if (iVar119 <= iVar121) {
            lVar88 = (long)iVar119;
            do {
              pUVar102 = *paUVar83 + pUVar99[lVar88];
              uVar100 = 0;
              do {
                psVar3 = (short *)((long)&local_1b4 + uVar100 * 2);
                *psVar3 = *psVar3 + (ushort)*pUVar102;
                uVar100 = uVar100 + 1;
                pUVar102 = pUVar102 + 0x102;
              } while (uVar96 != uVar100);
              lVar88 = lVar88 + 1;
            } while (iVar121 + 1 != (int)lVar88);
          }
        }
        else {
          uVar6 = pUVar99[iVar119];
          uVar7 = pUVar99[(long)iVar119 + 1];
          uVar8 = pUVar99[(long)iVar119 + 2];
          uVar9 = pUVar99[(long)iVar119 + 3];
          uVar10 = pUVar99[(long)iVar119 + 4];
          uVar11 = pUVar99[(long)iVar119 + 5];
          uVar12 = pUVar99[(long)iVar119 + 6];
          uVar13 = pUVar99[(long)iVar119 + 7];
          uVar14 = pUVar99[(long)iVar119 + 8];
          uVar15 = pUVar99[(long)iVar119 + 9];
          uVar16 = pUVar99[(long)iVar119 + 10];
          uVar17 = pUVar99[(long)iVar119 + 0xb];
          uVar18 = pUVar99[(long)iVar119 + 0xc];
          uVar19 = pUVar99[(long)iVar119 + 0xd];
          uVar20 = pUVar99[(long)iVar119 + 0xe];
          uVar21 = pUVar99[(long)iVar119 + 0xf];
          uVar22 = pUVar99[(long)iVar119 + 0x10];
          uVar23 = pUVar99[(long)iVar119 + 0x11];
          uVar24 = pUVar99[(long)iVar119 + 0x12];
          uVar25 = pUVar99[(long)iVar119 + 0x13];
          uVar26 = pUVar99[(long)iVar119 + 0x14];
          uVar27 = pUVar99[(long)iVar119 + 0x15];
          uVar28 = pUVar99[(long)iVar119 + 0x16];
          uVar29 = pUVar99[(long)iVar119 + 0x17];
          uVar30 = pUVar99[(long)iVar119 + 0x18];
          uVar31 = pUVar99[(long)iVar119 + 0x19];
          uVar32 = pUVar99[(long)iVar119 + 0x1a];
          uVar33 = pUVar99[(long)iVar119 + 0x1b];
          uVar34 = pUVar99[(long)iVar119 + 0x1c];
          uVar35 = pUVar99[(long)iVar119 + 0x1d];
          uVar36 = pUVar99[(long)iVar119 + 0x1e];
          uVar37 = pUVar99[(long)iVar119 + 0x1f];
          uVar38 = pUVar99[(long)iVar119 + 0x20];
          uVar39 = pUVar99[(long)iVar119 + 0x21];
          uVar40 = pUVar99[(long)iVar119 + 0x22];
          uVar41 = pUVar99[(long)iVar119 + 0x23];
          uVar42 = pUVar99[(long)iVar119 + 0x24];
          uVar43 = pUVar99[(long)iVar119 + 0x25];
          uVar44 = pUVar99[(long)iVar119 + 0x26];
          uVar45 = pUVar99[(long)iVar119 + 0x27];
          uVar46 = pUVar99[(long)iVar119 + 0x28];
          uVar47 = pUVar99[(long)iVar119 + 0x29];
          uVar48 = pUVar99[(long)iVar119 + 0x2a];
          uVar49 = pUVar99[(long)iVar119 + 0x2b];
          uVar50 = pUVar99[(long)iVar119 + 0x2c];
          uVar51 = pUVar99[(long)iVar119 + 0x2d];
          uVar52 = pUVar99[(long)iVar119 + 0x2e];
          uVar53 = pUVar99[(long)iVar119 + 0x2f];
          uVar54 = pUVar99[(long)iVar119 + 0x30];
          uVar55 = pUVar99[(long)iVar119 + 0x31];
          local_1b4 = s->len_pack[uVar7][0] + s->len_pack[uVar6][0] + s->len_pack[uVar8][0] +
                      s->len_pack[uVar9][0] + s->len_pack[uVar10][0] + s->len_pack[uVar11][0] +
                      s->len_pack[uVar12][0] + s->len_pack[uVar13][0] + s->len_pack[uVar14][0] +
                      s->len_pack[uVar15][0] + s->len_pack[uVar16][0] + s->len_pack[uVar17][0] +
                      s->len_pack[uVar18][0] + s->len_pack[uVar19][0] + s->len_pack[uVar20][0] +
                      s->len_pack[uVar21][0] + s->len_pack[uVar22][0] + s->len_pack[uVar23][0] +
                      s->len_pack[uVar24][0] + s->len_pack[uVar25][0] + s->len_pack[uVar26][0] +
                      s->len_pack[uVar27][0] + s->len_pack[uVar28][0] + s->len_pack[uVar29][0] +
                      s->len_pack[uVar30][0] + s->len_pack[uVar31][0] + s->len_pack[uVar32][0] +
                      s->len_pack[uVar33][0] + s->len_pack[uVar34][0] + s->len_pack[uVar35][0] +
                      s->len_pack[uVar36][0] + s->len_pack[uVar37][0] + s->len_pack[uVar38][0] +
                      s->len_pack[uVar39][0] + s->len_pack[uVar40][0] + s->len_pack[uVar41][0] +
                      s->len_pack[uVar42][0] + s->len_pack[uVar43][0] + s->len_pack[uVar44][0] +
                      s->len_pack[uVar45][0] + s->len_pack[uVar46][0] + s->len_pack[uVar47][0] +
                      s->len_pack[uVar48][0] + s->len_pack[uVar49][0] + s->len_pack[uVar50][0] +
                      s->len_pack[uVar51][0] + s->len_pack[uVar52][0] + s->len_pack[uVar53][0] +
                      s->len_pack[uVar54][0] + s->len_pack[uVar55][0];
          local_1b0 = s->len_pack[uVar7][1] + s->len_pack[uVar6][1] + s->len_pack[uVar8][1] +
                      s->len_pack[uVar9][1] + s->len_pack[uVar10][1] + s->len_pack[uVar11][1] +
                      s->len_pack[uVar12][1] + s->len_pack[uVar13][1] + s->len_pack[uVar14][1] +
                      s->len_pack[uVar15][1] + s->len_pack[uVar16][1] + s->len_pack[uVar17][1] +
                      s->len_pack[uVar18][1] + s->len_pack[uVar19][1] + s->len_pack[uVar20][1] +
                      s->len_pack[uVar21][1] + s->len_pack[uVar22][1] + s->len_pack[uVar23][1] +
                      s->len_pack[uVar24][1] + s->len_pack[uVar25][1] + s->len_pack[uVar26][1] +
                      s->len_pack[uVar27][1] + s->len_pack[uVar28][1] + s->len_pack[uVar29][1] +
                      s->len_pack[uVar30][1] + s->len_pack[uVar31][1] + s->len_pack[uVar32][1] +
                      s->len_pack[uVar33][1] + s->len_pack[uVar34][1] + s->len_pack[uVar35][1] +
                      s->len_pack[uVar36][1] + s->len_pack[uVar37][1] + s->len_pack[uVar38][1] +
                      s->len_pack[uVar39][1] + s->len_pack[uVar40][1] + s->len_pack[uVar41][1] +
                      s->len_pack[uVar42][1] + s->len_pack[uVar43][1] + s->len_pack[uVar44][1] +
                      s->len_pack[uVar45][1] + s->len_pack[uVar46][1] + s->len_pack[uVar47][1] +
                      s->len_pack[uVar48][1] + s->len_pack[uVar49][1] + s->len_pack[uVar50][1] +
                      s->len_pack[uVar51][1] + s->len_pack[uVar52][1] + s->len_pack[uVar53][1] +
                      s->len_pack[uVar54][1] + s->len_pack[uVar55][1];
          local_1ac = s->len_pack[uVar7][2] + s->len_pack[uVar6][2] + s->len_pack[uVar8][2] +
                      s->len_pack[uVar9][2] + s->len_pack[uVar10][2] + s->len_pack[uVar11][2] +
                      s->len_pack[uVar12][2] + s->len_pack[uVar13][2] + s->len_pack[uVar14][2] +
                      s->len_pack[uVar15][2] + s->len_pack[uVar16][2] + s->len_pack[uVar17][2] +
                      s->len_pack[uVar18][2] + s->len_pack[uVar19][2] + s->len_pack[uVar20][2] +
                      s->len_pack[uVar21][2] + s->len_pack[uVar22][2] + s->len_pack[uVar23][2] +
                      s->len_pack[uVar24][2] + s->len_pack[uVar25][2] + s->len_pack[uVar26][2] +
                      s->len_pack[uVar27][2] + s->len_pack[uVar28][2] + s->len_pack[uVar29][2] +
                      s->len_pack[uVar30][2] + s->len_pack[uVar31][2] + s->len_pack[uVar32][2] +
                      s->len_pack[uVar33][2] + s->len_pack[uVar34][2] + s->len_pack[uVar35][2] +
                      s->len_pack[uVar36][2] + s->len_pack[uVar37][2] + s->len_pack[uVar38][2] +
                      s->len_pack[uVar39][2] + s->len_pack[uVar40][2] + s->len_pack[uVar41][2] +
                      s->len_pack[uVar42][2] + s->len_pack[uVar43][2] + s->len_pack[uVar44][2] +
                      s->len_pack[uVar45][2] + s->len_pack[uVar46][2] + s->len_pack[uVar47][2] +
                      s->len_pack[uVar48][2] + s->len_pack[uVar49][2] + s->len_pack[uVar50][2] +
                      s->len_pack[uVar51][2] + s->len_pack[uVar52][2] + s->len_pack[uVar53][2] +
                      s->len_pack[uVar54][2] + s->len_pack[uVar55][2];
        }
        uVar100 = 0xffffffff;
        uVar103 = 0;
        uVar86 = 999999999;
        do {
          uVar6 = *(ushort *)((long)&local_1b4 + uVar103 * 2);
          uVar97 = uVar86;
          if (uVar6 <= uVar86) {
            uVar97 = (uint)uVar6;
          }
          if (uVar6 < uVar86) {
            uVar100 = uVar103 & 0xffffffff;
          }
          uVar103 = uVar103 + 1;
          uVar86 = uVar97;
        } while (uVar96 != uVar103);
        iVar85 = (int)uVar100;
        (&local_138)[iVar85] = (&local_138)[iVar85] + 1;
        s->selector[uVar82] = (UChar)uVar100;
        if (bVar91 == 0) {
          if (iVar119 <= iVar121) {
            lVar88 = 0;
            do {
              paIVar2[iVar85][pUVar99[iVar119 + lVar88]] =
                   paIVar2[iVar85][pUVar99[iVar119 + lVar88]] + 1;
              lVar88 = lVar88 + 1;
            } while ((iVar121 - iVar119) + 1 != (int)lVar88);
          }
        }
        else {
          paIVar2[iVar85][pUVar99[iVar119]] = paIVar2[iVar85][pUVar99[iVar119]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 1]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 1]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 2]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 2]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 3]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 3]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 4]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 4]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 5]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 5]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 6]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 6]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 7]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 7]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 8]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 8]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 9]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 9]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 10]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 10]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 0xb]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 0xb]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 0xc]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 0xc]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 0xd]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 0xd]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 0xe]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 0xe]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 0xf]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 0xf]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 0x10]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 0x10]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 0x11]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 0x11]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 0x12]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 0x12]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 0x13]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 0x13]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 0x14]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 0x14]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 0x15]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 0x15]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 0x16]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 0x16]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 0x17]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 0x17]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 0x18]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 0x18]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 0x19]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 0x19]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 0x1a]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 0x1a]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 0x1b]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 0x1b]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 0x1c]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 0x1c]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 0x1d]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 0x1d]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 0x1e]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 0x1e]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 0x1f]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 0x1f]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 0x20]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 0x20]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 0x21]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 0x21]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 0x22]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 0x22]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 0x23]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 0x23]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 0x24]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 0x24]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 0x25]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 0x25]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 0x26]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 0x26]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 0x27]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 0x27]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 0x28]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 0x28]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 0x29]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 0x29]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 0x2a]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 0x2a]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 0x2b]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 0x2b]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 0x2c]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 0x2c]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 0x2d]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 0x2d]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 0x2e]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 0x2e]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 0x2f]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 0x2f]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 0x30]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 0x30]] + 1;
          paIVar2[iVar85][pUVar99[(long)iVar119 + 0x31]] =
               paIVar2[iVar85][pUVar99[(long)iVar119 + 0x31]] + 1;
        }
        local_1a8._0_8_ = uVar82 + 1;
        iVar119 = iVar121 + 1;
        iVar85 = s->nMTF;
      } while (iVar119 < iVar85);
    }
    do {
      BZ2_hbMakeCodeLengths(*paUVar106,*paIVar108,local_1b8,0x11);
      uVar95 = uVar95 - 1;
      paUVar106 = paUVar106 + 1;
      paIVar108 = paIVar108 + 1;
    } while (uVar95 != 0);
    uVar86 = (int)local_158 + 1;
    uVar95 = (ulong)uVar86;
  } while (uVar86 != 4);
  uVar82 = local_1a8._0_8_;
  iVar85 = local_1a8._0_4_;
  if (0x4652 < iVar85) {
    bz_internal_error(0xbbb);
  }
  lVar88 = uVar96 - 1;
  auVar122._8_4_ = (int)lVar88;
  auVar122._0_8_ = lVar88;
  auVar122._12_4_ = (int)((ulong)lVar88 >> 0x20);
  auVar122 = auVar122 ^ _DAT_005d8eb0;
  iVar119 = auVar122._0_4_;
  iVar121 = auVar122._4_4_;
  iVar87 = auVar122._8_4_;
  iVar104 = auVar122._12_4_;
  auVar132._0_4_ = -(uint)(iVar119 < -0x80000000);
  auVar132._4_4_ = -(uint)(iVar119 < -0x80000000);
  auVar132._8_4_ = -(uint)(iVar87 < -0x7fffffff);
  auVar132._12_4_ = -(uint)(iVar87 < -0x7fffffff);
  auVar127._0_4_ = -(uint)(iVar121 == -0x80000000);
  auVar127._4_4_ = -(uint)(iVar121 == -0x80000000);
  auVar127._8_4_ = -(uint)(iVar104 == -0x80000000);
  auVar127._12_4_ = -(uint)(iVar104 == -0x80000000);
  auVar127 = auVar127 & auVar132;
  auVar109 = pshuflw(in_XMM4,auVar127,0xe8);
  auVar133._8_4_ = 0xffffffff;
  auVar133._0_8_ = 0xffffffffffffffff;
  auVar133._12_4_ = 0xffffffff;
  auVar109 = packssdw(auVar109 ^ auVar133,auVar109 ^ auVar133);
  if ((auVar109 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    local_1d8[0] = '\0';
  }
  auVar128 = packssdw(auVar127,auVar127);
  auVar128 = packssdw(auVar128 ^ auVar133,auVar128 ^ auVar133);
  if ((auVar128._0_4_ >> 0x10 & 1) != 0) {
    local_1d8[1] = 1;
  }
  auVar134._0_4_ = -(uint)(iVar119 < -0x7ffffffe);
  auVar134._4_4_ = -(uint)(iVar119 < -0x7ffffffe);
  auVar134._8_4_ = -(uint)(iVar87 < -0x7ffffffd);
  auVar134._12_4_ = -(uint)(iVar87 < -0x7ffffffd);
  auVar129._0_4_ = -(uint)(iVar121 == -0x80000000);
  auVar129._4_4_ = -(uint)(iVar121 == -0x80000000);
  auVar129._8_4_ = -(uint)(iVar104 == -0x80000000);
  auVar129._12_4_ = -(uint)(iVar104 == -0x80000000);
  auVar129 = auVar129 & auVar134;
  auVar109 = packssdw(auVar109,auVar129);
  auVar135._8_4_ = 0xffffffff;
  auVar135._0_8_ = 0xffffffffffffffff;
  auVar135._12_4_ = 0xffffffff;
  auVar109 = packssdw(auVar109 ^ auVar135,auVar109 ^ auVar135);
  if ((auVar109 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
    local_1d8[2] = 2;
  }
  auVar128 = pshufhw(auVar129,auVar129,0x84);
  auVar128 = packssdw(auVar128 ^ auVar135,auVar128 ^ auVar135);
  if ((auVar128 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
    local_1d8[3] = 3;
  }
  auVar136._0_4_ = -(uint)(iVar119 < -0x7ffffffc);
  auVar136._4_4_ = -(uint)(iVar119 < -0x7ffffffc);
  auVar136._8_4_ = -(uint)(iVar87 < -0x7ffffffb);
  auVar136._12_4_ = -(uint)(iVar87 < -0x7ffffffb);
  auVar130._0_4_ = -(uint)(iVar121 == -0x80000000);
  auVar130._4_4_ = -(uint)(iVar121 == -0x80000000);
  auVar130._8_4_ = -(uint)(iVar104 == -0x80000000);
  auVar130._12_4_ = -(uint)(iVar104 == -0x80000000);
  auVar130 = auVar130 & auVar136;
  auVar109 = pshuflw(auVar109,auVar130,0xe8);
  auVar137._8_4_ = 0xffffffff;
  auVar137._0_8_ = 0xffffffffffffffff;
  auVar137._12_4_ = 0xffffffff;
  auVar109 = packssdw(auVar109 ^ auVar137,auVar109 ^ auVar137);
  if ((auVar109 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    local_1d8[4] = 4;
  }
  auVar109 = packssdw(auVar130,auVar130);
  auVar109 = packssdw(auVar109 ^ auVar137,auVar109 ^ auVar137);
  if ((auVar109 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
    local_1d8[5] = 5;
  }
  auVar138._0_4_ = -(uint)(iVar119 < (int)DAT_00632e60);
  auVar138._4_4_ = -(uint)(iVar119 < (int)DAT_00632e60);
  auVar138._8_4_ = -(uint)(iVar87 < DAT_00632e60._8_4_);
  auVar138._12_4_ = -(uint)(iVar87 < DAT_00632e60._8_4_);
  auVar118._0_4_ = -(uint)(DAT_00632e60._4_4_ == iVar121);
  auVar118._4_4_ = -(uint)(DAT_00632e60._4_4_ == iVar121);
  auVar118._8_4_ = -(uint)(DAT_00632e60._12_4_ == iVar104);
  auVar118._12_4_ = -(uint)(DAT_00632e60._12_4_ == iVar104);
  auVar118 = auVar118 & auVar138;
  auVar109 = packssdw(_DAT_00632e60,auVar118);
  auVar123._8_4_ = 0xffffffff;
  auVar123._0_8_ = 0xffffffffffffffff;
  auVar123._12_4_ = 0xffffffff;
  auVar109 = packssdw(auVar109 ^ auVar123,auVar109 ^ auVar123);
  if ((auVar109 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
    local_1d8[6] = 6;
  }
  auVar109 = pshufhw(auVar118,auVar118,0x84);
  auVar109 = packssdw(auVar109 ^ auVar123,auVar109 ^ auVar123);
  if ((auVar109 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
    local_1d8[7] = 7;
  }
  if (0 < iVar85) {
    uVar95 = 0;
    UVar92 = local_1d8[0];
    do {
      UVar4 = s->selector[uVar95];
      lVar88 = 0;
      while (UVar4 != UVar92) {
        UVar5 = local_1d8[lVar88 + 1];
        local_1d8[lVar88 + 1] = UVar92;
        lVar88 = lVar88 + 1;
        UVar92 = UVar5;
      }
      s->selectorMtf[uVar95] = (UChar)lVar88;
      uVar95 = uVar95 + 1;
    } while (uVar95 != (uVar82 & 0xffffffff));
  }
  uVar95 = 0;
  paUVar106 = paUVar1;
  local_180 = uVar82 & 0xffffffff;
  do {
    uVar97 = 0x20;
    uVar86 = 0;
    if (-2 < (int)local_188) {
      sVar107 = 0;
      uVar86 = 0;
      do {
        uVar94 = (uint)(*paUVar106)[sVar107];
        if (uVar86 <= (*paUVar106)[sVar107]) {
          uVar86 = uVar94;
        }
        if (uVar94 <= uVar97) {
          uVar97 = uVar94;
        }
        sVar107 = sVar107 + 1;
      } while (local_190 != sVar107);
    }
    if (0x11 < uVar86) {
      bz_internal_error(0xbbc);
    }
    if (uVar97 == 0) {
      bz_internal_error(0xbbd);
    }
    BZ2_hbAssignCodes(s->code[uVar95],paUVar1[uVar95],uVar97,uVar86,local_1b8);
    pUVar99 = local_1c8;
    uVar95 = uVar95 + 1;
    paUVar106 = paUVar106 + 1;
  } while (uVar95 != uVar96);
  lVar88 = 0;
  iVar85 = local_1a8._0_4_;
  pBVar101 = local_170;
  do {
    local_1d8[lVar88] = '\0';
    auVar124[0] = -(*pBVar101 == '\0');
    auVar124[1] = -(pBVar101[1] == '\0');
    auVar124[2] = -(pBVar101[2] == '\0');
    auVar124[3] = -(pBVar101[3] == '\0');
    auVar124[4] = -(pBVar101[4] == '\0');
    auVar124[5] = -(pBVar101[5] == '\0');
    auVar124[6] = -(pBVar101[6] == '\0');
    auVar124[7] = -(pBVar101[7] == '\0');
    auVar124[8] = -(pBVar101[8] == '\0');
    auVar124[9] = -(pBVar101[9] == '\0');
    auVar124[10] = -(pBVar101[10] == '\0');
    auVar124[0xb] = -(pBVar101[0xb] == '\0');
    auVar124[0xc] = -(pBVar101[0xc] == '\0');
    auVar124[0xd] = -(pBVar101[0xd] == '\0');
    auVar124[0xe] = -(pBVar101[0xe] == '\0');
    auVar124[0xf] = -(pBVar101[0xf] == '\0');
    if ((ushort)((ushort)(SUB161(auVar124 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar124 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar124 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar124 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar124 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar124 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar124 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar124 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar124 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar124 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar124 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar124 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar124 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar124 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar124 >> 0x77,0) & 1) << 0xe |
                (ushort)(auVar124[0xf] >> 7) << 0xf) != 0xffff) {
      local_1d8[lVar88] = '\x01';
    }
    lVar88 = lVar88 + 1;
    pBVar101 = pBVar101 + 0x10;
  } while (lVar88 != 0x10);
  lVar88 = 0;
  do {
    iVar119 = s->bsLive;
    if (local_1d8[lVar88] == '\0') {
      if (7 < iVar119) {
        do {
          s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
          s->numZ = s->numZ + 1;
          s->bsBuff = s->bsBuff << 8;
          iVar121 = s->bsLive;
          iVar119 = iVar121 + -8;
          s->bsLive = iVar119;
        } while (0xf < iVar121);
      }
    }
    else {
      if (7 < iVar119) {
        do {
          s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
          s->numZ = s->numZ + 1;
          s->bsBuff = s->bsBuff << 8;
          iVar121 = s->bsLive;
          iVar119 = iVar121 + -8;
          s->bsLive = iVar119;
        } while (0xf < iVar121);
      }
      s->bsBuff = s->bsBuff | 0x80000000U >> ((byte)iVar119 & 0x1f);
    }
    s->bsLive = iVar119 + 1;
    lVar88 = lVar88 + 1;
  } while (lVar88 != 0x10);
  lVar88 = 0;
  do {
    if (local_1d8[lVar88] != '\0') {
      lVar98 = 0;
      do {
        iVar119 = s->bsLive;
        if (s->inUse[lVar98 + lVar88 * 0x10] == '\0') {
          if (7 < iVar119) {
            do {
              s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
              s->numZ = s->numZ + 1;
              s->bsBuff = s->bsBuff << 8;
              iVar121 = s->bsLive;
              iVar119 = iVar121 + -8;
              s->bsLive = iVar119;
            } while (0xf < iVar121);
          }
        }
        else {
          if (7 < iVar119) {
            do {
              s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
              s->numZ = s->numZ + 1;
              s->bsBuff = s->bsBuff << 8;
              iVar121 = s->bsLive;
              iVar119 = iVar121 + -8;
              s->bsLive = iVar119;
            } while (0xf < iVar121);
          }
          s->bsBuff = s->bsBuff | 0x80000000U >> ((byte)iVar119 & 0x1f);
        }
        s->bsLive = iVar119 + 1;
        lVar98 = lVar98 + 1;
      } while (lVar98 != 0x10);
    }
    lVar88 = lVar88 + 1;
  } while (lVar88 != 0x10);
  iVar119 = s->bsLive;
  if (7 < iVar119) {
    do {
      s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
      s->numZ = s->numZ + 1;
      s->bsBuff = s->bsBuff << 8;
      iVar121 = s->bsLive;
      iVar119 = iVar121 + -8;
      s->bsLive = iVar119;
    } while (0xf < iVar121);
  }
  s->bsBuff = s->bsBuff | uVar93 << (0x1dU - (char)iVar119 & 0x1f);
  iVar119 = iVar119 + 3;
  s->bsLive = iVar119;
  if (7 < iVar119) {
    do {
      s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
      s->numZ = s->numZ + 1;
      s->bsBuff = s->bsBuff << 8;
      iVar121 = s->bsLive;
      iVar119 = iVar121 + -8;
      s->bsLive = iVar119;
    } while (0xf < iVar121);
  }
  s->bsBuff = s->bsBuff | iVar85 << (0x11U - (char)iVar119 & 0x1f);
  s->bsLive = iVar119 + 0xf;
  if (0 < iVar85) {
    uVar95 = 0;
    do {
      if (s->selectorMtf[uVar95] != '\0') {
        uVar86 = 0;
        do {
          iVar119 = s->bsLive;
          if (7 < iVar119) {
            do {
              s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
              s->numZ = s->numZ + 1;
              s->bsBuff = s->bsBuff << 8;
              iVar121 = s->bsLive;
              iVar119 = iVar121 + -8;
              s->bsLive = iVar119;
            } while (0xf < iVar121);
          }
          s->bsBuff = s->bsBuff | 0x80000000U >> ((byte)iVar119 & 0x1f);
          s->bsLive = iVar119 + 1;
          uVar86 = uVar86 + 1;
        } while (uVar86 < s->selectorMtf[uVar95]);
      }
      iVar119 = s->bsLive;
      if (7 < iVar119) {
        do {
          s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
          s->numZ = s->numZ + 1;
          s->bsBuff = s->bsBuff << 8;
          iVar121 = s->bsLive;
          iVar119 = iVar121 + -8;
          s->bsLive = iVar119;
        } while (0xf < iVar121);
      }
      s->bsLive = iVar119 + 1;
      uVar95 = uVar95 + 1;
    } while (uVar95 != local_180);
  }
  uVar95 = 0;
  do {
    bVar84 = paUVar1[uVar95][0];
    uVar86 = (uint)bVar84;
    iVar119 = s->bsLive;
    if (7 < iVar119) {
      do {
        s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
        s->numZ = s->numZ + 1;
        s->bsBuff = s->bsBuff << 8;
        iVar121 = s->bsLive;
        iVar119 = iVar121 + -8;
        s->bsLive = iVar119;
      } while (0xf < iVar121);
    }
    s->bsBuff = s->bsBuff | (uint)bVar84 << (0x1bU - (char)iVar119 & 0x1f);
    s->bsLive = iVar119 + 5;
    if (-2 < (int)local_188) {
      sVar107 = 0;
      do {
        bVar84 = paUVar1[uVar95][sVar107];
        for (; (int)uVar86 < (int)(uint)bVar84; uVar86 = uVar86 + 1) {
          iVar119 = s->bsLive;
          if (7 < iVar119) {
            do {
              s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
              s->numZ = s->numZ + 1;
              s->bsBuff = s->bsBuff << 8;
              iVar121 = s->bsLive;
              iVar119 = iVar121 + -8;
              s->bsLive = iVar119;
            } while (0xf < iVar121);
          }
          s->bsBuff = s->bsBuff | 2 << (0x1eU - (char)iVar119 & 0x1f);
          s->bsLive = iVar119 + 2;
          bVar84 = paUVar1[uVar95][sVar107];
        }
        for (; (int)(uint)paUVar1[uVar95][sVar107] < (int)uVar86; uVar86 = uVar86 - 1) {
          iVar119 = s->bsLive;
          if (7 < iVar119) {
            do {
              s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
              s->numZ = s->numZ + 1;
              s->bsBuff = s->bsBuff << 8;
              iVar121 = s->bsLive;
              iVar119 = iVar121 + -8;
              s->bsLive = iVar119;
            } while (0xf < iVar121);
          }
          s->bsBuff = s->bsBuff | 3 << (0x1eU - (char)iVar119 & 0x1f);
          s->bsLive = iVar119 + 2;
        }
        iVar119 = s->bsLive;
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar121 = s->bsLive;
            iVar119 = iVar121 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar121);
        }
        s->bsLive = iVar119 + 1;
        sVar107 = sVar107 + 1;
      } while (sVar107 != local_190);
    }
    uVar95 = uVar95 + 1;
  } while (uVar95 != uVar96);
  iVar119 = s->nMTF;
  lVar88 = 0;
  if (0 < iVar119) {
    iVar85 = 0;
    do {
      iVar121 = iVar119 + -1;
      if (iVar85 + 0x31 < iVar119) {
        iVar121 = iVar85 + 0x31;
      }
      if (uVar93 <= s->selector[lVar88]) {
        bz_internal_error(0xbbe);
      }
      if (((byte)local_1c0 & iVar121 - iVar85 == 0x31) == 0) {
        if (iVar85 <= iVar121) {
          lVar98 = (long)iVar85;
          do {
            bVar84 = s->selector[lVar88];
            bVar91 = (*paUVar1)[(ulong)pUVar99[lVar98] + (ulong)bVar84 * 0x100 + (ulong)bVar84 * 2];
            iVar119 = s->code[0][(ulong)bVar84 * 2 + (ulong)bVar84 * 0x100 + (ulong)pUVar99[lVar98]]
            ;
            iVar85 = s->bsLive;
            if (7 < iVar85) {
              do {
                s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
                s->numZ = s->numZ + 1;
                s->bsBuff = s->bsBuff << 8;
                iVar87 = s->bsLive;
                iVar85 = iVar87 + -8;
                s->bsLive = iVar85;
              } while (0xf < iVar87);
            }
            iVar85 = iVar85 + (uint)bVar91;
            s->bsBuff = s->bsBuff | iVar119 << (-(char)iVar85 & 0x1fU);
            s->bsLive = iVar85;
            lVar98 = lVar98 + 1;
          } while (iVar121 + 1 != (int)lVar98);
        }
      }
      else {
        bVar84 = s->selector[lVar88];
        uVar96 = (ulong)bVar84;
        lVar98 = (ulong)bVar84 * 0x100 + uVar96 * 2;
        uVar95 = (ulong)bVar84;
        bVar84 = (*paUVar1)[(ulong)pUVar99[iVar85] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[iVar85]];
        iVar119 = s->bsLive;
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 1] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 1]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 2] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 2]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 3] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 3]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 4] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 4]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 5] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 5]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 6] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 6]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 7] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 7]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 8] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 8]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 9] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 9]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 10] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 10]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 0xb] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 0xb]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 0xc] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 0xc]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 0xd] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 0xd]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 0xe] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 0xe]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 0xf] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 0xf]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 0x10] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 0x10]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 0x11] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 0x11]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 0x12] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 0x12]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 0x13] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 0x13]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 0x14] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 0x14]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 0x15] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 0x15]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 0x16] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 0x16]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 0x17] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 0x17]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 0x18] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 0x18]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 0x19] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 0x19]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 0x1a] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 0x1a]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 0x1b] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 0x1b]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 0x1c] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 0x1c]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 0x1d] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 0x1d]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 0x1e] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 0x1e]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 0x1f] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 0x1f]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 0x20] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 0x20]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 0x21] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 0x21]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 0x22] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 0x22]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 0x23] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 0x23]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 0x24] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 0x24]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 0x25] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 0x25]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 0x26] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 0x26]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 0x27] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 0x27]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 0x28] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 0x28]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 0x29] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 0x29]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 0x2a] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 0x2a]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 0x2b] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 0x2b]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 0x2c] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 0x2c]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 0x2d] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 0x2d]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 0x2e] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 0x2e]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 0x2f] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 0x2f]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 0x30] + lVar98];
        iVar87 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 0x30]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar104 = s->bsLive;
            iVar119 = iVar104 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar104);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar87 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
        bVar84 = (*paUVar1)[(ulong)pUVar99[(long)iVar85 + 0x31] + lVar98];
        iVar85 = s->code[0][uVar96 * 2 + uVar95 * 0x100 + (ulong)pUVar99[(long)iVar85 + 0x31]];
        if (7 < iVar119) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar87 = s->bsLive;
            iVar119 = iVar87 + -8;
            s->bsLive = iVar119;
          } while (0xf < iVar87);
        }
        iVar119 = iVar119 + (uint)bVar84;
        s->bsBuff = s->bsBuff | iVar85 << (-(char)iVar119 & 0x1fU);
        s->bsLive = iVar119;
      }
      iVar85 = iVar121 + 1;
      lVar88 = lVar88 + 1;
      iVar119 = s->nMTF;
    } while (iVar85 < iVar119);
    iVar85 = local_1a8._0_4_;
  }
  if ((int)lVar88 != iVar85) {
    bz_internal_error(0xbbf);
  }
  is_last_block = (Bool)local_174;
LAB_00574082:
  if (is_last_block != '\0') {
    bsPutUChar(s,'\x17');
    bsPutUChar(s,'r');
    bsPutUChar(s,'E');
    bsPutUChar(s,'8');
    bsPutUChar(s,'P');
    bsPutUChar(s,0x90);
    bsPutUInt32(s,s->combinedCRC);
    if (0 < s->bsLive) {
      do {
        s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
        s->numZ = s->numZ + 1;
        s->bsBuff = s->bsBuff << 8;
        iVar85 = s->bsLive;
        s->bsLive = iVar85 + -8;
      } while (8 < iVar85);
    }
  }
  return;
}

Assistant:

void BZ2_compressBlock ( EState* s, Bool is_last_block )
{
   if (s->nblock > 0) {

      BZ_FINALISE_CRC ( s->blockCRC );
      s->combinedCRC = (s->combinedCRC << 1) | (s->combinedCRC >> 31);
      s->combinedCRC ^= s->blockCRC;
      if (s->blockNo > 1) s->numZ = 0;

      if (s->verbosity >= 2)
         VPrintf4( "    block %d: crc = 0x%08x, "
                   "combined CRC = 0x%08x, size = %d\n",
                   s->blockNo, s->blockCRC, s->combinedCRC, s->nblock );

      BZ2_blockSort ( s );
   }

   s->zbits = (UChar*) (&((UChar*)s->arr2)[s->nblock]);

   /*-- If this is the first block, create the stream header. --*/
   if (s->blockNo == 1) {
      BZ2_bsInitWrite ( s );
      bsPutUChar ( s, BZ_HDR_B );
      bsPutUChar ( s, BZ_HDR_Z );
      bsPutUChar ( s, BZ_HDR_h );
      bsPutUChar ( s, (UChar)(BZ_HDR_0 + s->blockSize100k) );
   }

   if (s->nblock > 0) {

      bsPutUChar ( s, 0x31 ); bsPutUChar ( s, 0x41 );
      bsPutUChar ( s, 0x59 ); bsPutUChar ( s, 0x26 );
      bsPutUChar ( s, 0x53 ); bsPutUChar ( s, 0x59 );

      /*-- Now the block's CRC, so it is in a known place. --*/
      bsPutUInt32 ( s, s->blockCRC );

      /*-- 
         Now a single bit indicating (non-)randomisation. 
         As of version 0.9.5, we use a better sorting algorithm
         which makes randomisation unnecessary.  So always set
         the randomised bit to 'no'.  Of course, the decoder
         still needs to be able to handle randomised blocks
         so as to maintain backwards compatibility with
         older versions of bzip2.
      --*/
      bsW(s,1,0);

      bsW ( s, 24, s->origPtr );
      generateMTFValues ( s );
      sendMTFValues ( s );
   }


   /*-- If this is the last block, add the stream trailer. --*/
   if (is_last_block) {

      bsPutUChar ( s, 0x17 ); bsPutUChar ( s, 0x72 );
      bsPutUChar ( s, 0x45 ); bsPutUChar ( s, 0x38 );
      bsPutUChar ( s, 0x50 ); bsPutUChar ( s, 0x90 );
      bsPutUInt32 ( s, s->combinedCRC );
      if (s->verbosity >= 2)
         VPrintf1( "    final combined CRC = 0x%08x\n   ", s->combinedCRC );
      bsFinishWrite ( s );
   }
}